

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O1

Value * __thiscall
ot::commissioner::Interpreter::ProcessStartJob
          (Value *__return_storage_ptr__,Interpreter *this,CommissionerAppPtr *aCommissioner,
          Expression *aExpr)

{
  pointer pbVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  element_type *peVar3;
  type tVar4;
  long lVar5;
  char *pcVar6;
  char *begin;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  format_args args;
  uint16_t port;
  Error error;
  string existingCommissionerId;
  ushort local_122;
  type local_120;
  uint *local_118;
  long local_110;
  uint local_108;
  undefined4 uStack_104;
  undefined4 uStack_100;
  undefined4 uStack_fc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  undefined1 local_d8 [8];
  _Alloc_hider local_d0;
  size_type local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  parse_func local_b0 [1];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a8;
  undefined1 local_a0 [8];
  undefined1 *local_98;
  undefined1 local_90 [8];
  undefined1 local_88 [16];
  type local_78;
  uint *local_70;
  long local_68;
  uint local_60;
  undefined4 uStack_5c;
  undefined4 uStack_58;
  undefined4 uStack_54;
  string local_50;
  
  local_120 = 0;
  local_118 = &local_108;
  local_110 = 0;
  local_108 = local_108 & 0xffffff00;
  local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
  local_f8._M_string_length = 0;
  local_f8.field_2._M_local_buf[0] = '\0';
  pbVar1 = (aExpr->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(aExpr->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1) < 0x41) {
    local_d8._0_4_ = none_type;
    local_d0._M_p = "too few arguments";
    local_c8 = 0x11;
    local_c0._M_allocated_capacity = 0;
    local_b0[0] = (parse_func)0x0;
    begin = "too few arguments";
    local_c0._8_8_ = (format_string_checker<char> *)local_d8;
    do {
      pcVar6 = begin + 1;
      if (*begin == '}') {
        if ((pcVar6 == "") || (*pcVar6 != '}')) {
          fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar6 = begin + 2;
      }
      else if (*begin == '{') {
        pcVar6 = fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (begin,"",(format_string_checker<char> *)local_d8);
      }
      begin = pcVar6;
    } while (pcVar6 != "");
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)local_d8;
    fmt::v10::vformat_abi_cxx11_
              (&local_50,(v10 *)"too few arguments",(string_view)ZEXT816(0x11),args);
    local_a0._0_4_ = uint_type;
    local_98 = local_88;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_98,local_50._M_dataplus._M_p,
               local_50._M_dataplus._M_p + local_50._M_string_length);
    local_120 = local_a0._0_4_;
    std::__cxx11::string::operator=((string *)&local_118,(string *)&local_98);
    if (local_98 != local_88) {
      operator_delete(local_98);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
  }
  else {
    utils::ParseInteger<unsigned_short>((Error *)local_d8,&local_122,pbVar1 + 2);
    local_120 = local_d8._0_4_;
    std::__cxx11::string::operator=((string *)&local_118,(string *)&local_d0);
    tVar4 = local_120;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_p != &local_c0) {
      operator_delete(local_d0._M_p);
    }
    if (tVar4 == none_type) {
      local_a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::
                 __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const[15]>>
                           ((this->mContext).mCommandKeys.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (this->mContext).mCommandKeys.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish,"--connect-only");
      pbVar2 = (this->mContext).mCommandKeys.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (local_a8 == pbVar2) {
        peVar3 = (aCommissioner->
                 super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr;
        (*(peVar3->super_CommissionerHandler)._vptr_CommissionerHandler[0xc])
                  (local_d8,peVar3,&local_f8,
                   (aExpr->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start + 1,(ulong)local_122);
      }
      else {
        peVar3 = (aCommissioner->
                 super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr;
        (*(peVar3->super_CommissionerHandler)._vptr_CommissionerHandler[10])
                  (local_d8,peVar3,
                   (aExpr->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start + 1,(ulong)local_122);
      }
      local_120 = local_d8._0_4_;
      std::__cxx11::string::operator=((string *)&local_118,(string *)&local_d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_p != &local_c0) {
        operator_delete(local_d0._M_p);
      }
      if (local_a8 != pbVar2) goto LAB_0012afc1;
    }
  }
  tVar4 = local_120;
  if (local_f8._M_string_length != 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
                   "there is an existing active commissioner: ",&local_f8);
    local_d8._0_4_ = tVar4;
    local_d0._M_p = (pointer)&local_c0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_d0,CONCAT44(local_a0._4_4_,local_a0._0_4_),
               local_98 + CONCAT44(local_a0._4_4_,local_a0._0_4_));
    local_120 = local_d8._0_4_;
    std::__cxx11::string::operator=((string *)&local_118,(string *)&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_p != &local_c0) {
      operator_delete(local_d0._M_p);
    }
    if ((undefined1 *)CONCAT44(local_a0._4_4_,local_a0._0_4_) != local_90) {
      operator_delete((undefined1 *)CONCAT44(local_a0._4_4_,local_a0._0_4_));
    }
  }
LAB_0012afc1:
  lVar5 = local_110;
  local_78 = local_120;
  if (local_118 == &local_108) {
    uStack_58 = uStack_100;
    uStack_54 = uStack_fc;
    local_70 = &local_60;
  }
  else {
    local_70 = local_118;
  }
  _local_60 = CONCAT44(uStack_104,local_108);
  local_68 = local_110;
  local_110 = 0;
  local_108 = local_108 & 0xffffff00;
  (__return_storage_ptr__->mError).mCode = local_120;
  (__return_storage_ptr__->mError).mMessage._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mError).mMessage.field_2;
  local_118 = &local_108;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(__return_storage_ptr__->mError).mMessage,local_70,lVar5 + (long)local_70);
  (__return_storage_ptr__->mData)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mData).field_2;
  (__return_storage_ptr__->mData)._M_string_length = 0;
  (__return_storage_ptr__->mData).field_2._M_local_buf[0] = '\0';
  if (local_70 != &local_60) {
    operator_delete(local_70);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p);
  }
  if (local_118 != &local_108) {
    operator_delete(local_118);
  }
  return __return_storage_ptr__;
}

Assistant:

Interpreter::Value Interpreter::ProcessStartJob(CommissionerAppPtr &aCommissioner, const Expression &aExpr)
{
    Error       error;
    uint16_t    port;
    std::string existingCommissionerId;
    bool        connectOnly = false;

    VerifyOrExit(aExpr.size() >= 3, error = ERROR_INVALID_ARGS(SYNTAX_FEW_ARGS));
    SuccessOrExit(error = ParseInteger(port, aExpr[2]));

    {
        auto it = std::find(mContext.mCommandKeys.begin(), mContext.mCommandKeys.end(), "--connect-only");

        if (it != mContext.mCommandKeys.end())
        {
            connectOnly = true;
            error       = aCommissioner->Connect(aExpr[1], port);
        }
        else
        {
            error = aCommissioner->Start(existingCommissionerId, aExpr[1], port);
        }
    }

exit:
    if (!connectOnly && !existingCommissionerId.empty())
    {
        error = Error{error.GetCode(), "there is an existing active commissioner: " + existingCommissionerId};
    }
    return error;
}